

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdFinalizeFundRawTx
              (void *handle,void *fund_handle,char *tx_hex,double effective_fee_rate,int64_t *tx_fee
              ,uint32_t *append_txout_count,char **output_tx_hex)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  int64_t iVar4;
  size_type sVar5;
  int64_t *in_RCX;
  char *in_RDX;
  long in_RSI;
  undefined4 *in_R8;
  undefined8 *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar7;
  CfdException *except;
  exception *std_except;
  TransactionController txc;
  TransactionApi api_1;
  Amount target_value;
  value_type *target_1;
  ConfidentialTransactionController ctxc;
  ElementsTransactionApi api;
  CfdCapiFundTargetAmount *target;
  iterator __end3;
  iterator __begin3;
  vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxo_list;
  Amount calc_fee;
  Amount tx_fee_value;
  UtxoFilter filter;
  Amount utxo_fee_value;
  CoinSelectionOption option_params;
  CfdCapiFundRawTxData *buffer;
  anon_class_1_0_00000001 convert_to_asset;
  int result;
  double in_stack_000007e0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_000007e8;
  Amount *in_stack_000007f0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_000007f8;
  string *in_stack_00000800;
  TransactionApi *in_stack_00000808;
  string *in_stack_00000820;
  Amount *in_stack_00000828;
  UtxoFilter *in_stack_00000830;
  CoinSelectionOption *in_stack_00000838;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000840;
  NetType_conflict in_stack_00000848;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_00000850;
  Amount *in_stack_00000858;
  double in_stack_00000e50;
  undefined1 in_stack_00000e5f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_00000e60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_00000e68;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_00000e70;
  string *in_stack_00000e78;
  ElementsTransactionApi *in_stack_00000e80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000ea0;
  ConfidentialAssetId *in_stack_00000ea8;
  Amount *in_stack_00000eb8;
  UtxoFilter *in_stack_00000ec0;
  CoinSelectionOption *in_stack_00000ec8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000ed0;
  NetType_conflict in_stack_00000ed8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_00000ee0;
  Amount *in_stack_00000ee8;
  ConfidentialAssetId *in_stack_fffffffffffffae8;
  AbstractTransactionController *pAVar8;
  CoinSelectionOption *in_stack_fffffffffffffaf0;
  ConfidentialTransactionController *this;
  TransactionController *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this_01;
  undefined8 in_stack_fffffffffffffb08;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb50;
  uint8_t *in_stack_fffffffffffffb60;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb68;
  string *prefix;
  void *in_stack_fffffffffffffc00;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [24];
  CoinSelectionOption *in_stack_fffffffffffffc50;
  TransactionApi local_351;
  Amount local_350;
  reference local_340;
  string local_338 [39];
  allocator local_311;
  string local_310 [119];
  ElementsTransactionApi local_299;
  _Base_ptr local_298;
  undefined1 local_290;
  _Base_ptr local_288;
  undefined1 local_280;
  Amount local_278;
  reference local_268;
  CfdCapiFundTargetAmount *local_260;
  __normal_iterator<cfd::capi::CfdCapiFundTargetAmount_*,_std::vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>_>
  local_258;
  undefined8 local_250;
  AbstractTransactionController local_248 [9];
  CoinSelectionOption *in_stack_fffffffffffffe50;
  Amount local_1a8;
  undefined1 local_198 [144];
  long local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_79 [53];
  undefined4 local_44;
  undefined8 *local_40;
  undefined4 *local_38;
  int64_t *local_30;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  local_44 = 0xffffffff;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  prefix = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_79 + 1),"FundRawTxData",(allocator *)prefix);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffc00,prefix);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xcc1;
    local_98.funcname = "CfdFinalizeFundRawTx";
    cfd::core::logger::warn<>(&local_98,"tx_hex is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. tx_hex is null or empty.",&local_b9)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb10,error_code,in_stack_fffffffffffffb00);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_40 == (undefined8 *)0x0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0xcc7;
    local_d8.funcname = "CfdFinalizeFundRawTx";
    cfd::core::logger::warn<>(&local_d8,"output_tx_hex is null.");
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Failed to parameter. output_tx_hex is null.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb10,error_code,in_stack_fffffffffffffb00);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_108 = local_18;
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffaf0);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8);
  cfd::CoinSelectionOption::SetDustFeeRate
            (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange
            ((CoinSelectionOption *)(local_198 + 0x28),*(int64_t *)(local_108 + 0x80));
  cfd::CoinSelectionOption::SetBlindInfo
            ((CoinSelectionOption *)(local_198 + 0x28),*(int *)(local_108 + 0x88),
             *(int *)(local_108 + 0x8c));
  cfd::core::Amount::Amount((Amount *)(local_198 + 0x18));
  cfd::core::Amount::Amount((Amount *)local_198);
  cfd::core::Amount::Amount(&local_1a8);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x65d0a5);
  if ((*(byte *)(local_108 + 0x35) & 1) == 0) {
    cfd::CoinSelectionOption::InitializeTxSizeInfo(in_stack_fffffffffffffc50);
    local_340 = std::
                vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                ::at((vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                      *)in_stack_fffffffffffffaf0,(size_type)in_stack_fffffffffffffae8);
    cfd::core::Amount::Amount(&local_350,local_340->amount);
    cfd::api::TransactionApi::TransactionApi(&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,local_20,&local_3c9);
    pAVar8 = (AbstractTransactionController *)&local_340->reserved_address;
    this_01 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_198 + 0x28);
    this_00 = (TransactionController *)local_198;
    cfd::api::TransactionApi::FundRawTransaction
              (in_stack_00000808,in_stack_00000800,in_stack_000007f8,in_stack_000007f0,
               in_stack_000007e8,in_stack_00000820,in_stack_000007e0,in_stack_00000828,
               in_stack_00000830,in_stack_00000838,in_stack_00000840,in_stack_00000848,
               in_stack_00000850,in_stack_00000858);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    if (local_40 != (undefined8 *)0x0) {
      cfd::AbstractTransactionController::GetHex_abi_cxx11_(pAVar8);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffb50);
      *local_40 = pcVar3;
      std::__cxx11::string::~string(local_3f0);
    }
    cfd::TransactionController::~TransactionController(this_00);
  }
  else {
    cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_fffffffffffffe50);
    CfdFinalizeFundRawTx::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
           *)0x65d10d);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x65d11a);
    local_250 = *(undefined8 *)(local_108 + 0x58);
    local_258._M_current =
         (CfdCapiFundTargetAmount *)
         std::
         vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
         ::begin((vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                  *)in_stack_fffffffffffffae8);
    local_260 = (CfdCapiFundTargetAmount *)
                std::
                vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                ::end((vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                       *)in_stack_fffffffffffffae8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::capi::CfdCapiFundTargetAmount_*,_std::vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<cfd::capi::CfdCapiFundTargetAmount_*,_std::vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>_>
                          *)in_stack_fffffffffffffae8);
      if (!bVar1) break;
      local_268 = __gnu_cxx::
                  __normal_iterator<cfd::capi::CfdCapiFundTargetAmount_*,_std::vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>_>
                  ::operator*(&local_258);
      cfd::core::Amount::Amount(&local_278,local_268->amount);
      pVar6 = std::
              map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              ::emplace<std::__cxx11::string_const&,cfd::core::Amount>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                          *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                         (Amount *)in_stack_fffffffffffffaf0);
      local_288 = (_Base_ptr)pVar6.first._M_node;
      local_280 = pVar6.second;
      pVar7 = std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)local_248,&local_268->asset,&local_268->reserved_address);
      local_298 = (_Base_ptr)pVar7.first._M_node;
      local_290 = pVar7.second;
      __gnu_cxx::
      __normal_iterator<cfd::capi::CfdCapiFundTargetAmount_*,_std::vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>_>
      ::operator++(&local_258);
    }
    cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,local_20,&local_311);
    this_01 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_198;
    this = (ConfidentialTransactionController *)(local_248 + 6);
    pAVar8 = local_248;
    cfd::api::ElementsTransactionApi::FundRawTransaction
              (in_stack_00000e80,in_stack_00000e78,in_stack_00000e70,in_stack_00000e68,
               in_stack_00000e60,in_stack_00000ea0,in_stack_00000ea8,(bool)in_stack_00000e5f,
               in_stack_00000e50,in_stack_00000eb8,in_stack_00000ec0,in_stack_00000ec8,
               in_stack_00000ed0,in_stack_00000ed8,in_stack_00000ee0,in_stack_00000ee8);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    if (local_40 != (undefined8 *)0x0) {
      cfd::AbstractTransactionController::GetHex_abi_cxx11_(pAVar8);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffb50);
      *local_40 = pcVar3;
      std::__cxx11::string::~string(local_338);
    }
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(this);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x65d4d2);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
            *)0x65d4df);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x65d4ec);
  }
  iVar4 = cfd::core::Amount::GetSatoshiValue(&local_1a8);
  *(int64_t *)(local_108 + 0x60) = iVar4;
  if (local_30 != (int64_t *)0x0) {
    iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_198);
    *local_30 = iVar4;
  }
  if (local_38 != (undefined4 *)0x0) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)(local_108 + 0x50));
    *local_38 = (int)sVar5;
  }
  local_44 = 0;
  local_4 = 0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x65d83b);
  return local_4;
}

Assistant:

int CfdFinalizeFundRawTx(
    void* handle, void* fund_handle, const char* tx_hex,
    double effective_fee_rate, int64_t* tx_fee, uint32_t* append_txout_count,
    char** output_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
#ifndef CFD_DISABLE_ELEMENTS
  auto convert_to_asset = [](const uint8_t* asset) -> ConfidentialAssetId {
    std::vector<uint8_t> bytes(33);
    memcpy(bytes.data(), asset, bytes.size());
    return ConfidentialAssetId(ByteData(bytes));
  };
#endif  // CFD_DISABLE_ELEMENTS

  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }
    if (output_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "output_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output_tx_hex is null.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    CoinSelectionOption option_params;
    option_params.SetEffectiveFeeBaserate(effective_fee_rate);
    option_params.SetLongTermFeeBaserate(buffer->long_term_fee_rate);
    option_params.SetDustFeeRate(buffer->dust_fee_rate);
    option_params.SetKnapsackMinimumChange(buffer->knapsack_min_change);
#ifndef CFD_DISABLE_ELEMENTS
    option_params.SetBlindInfo(buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS

    Amount utxo_fee_value;
    UtxoFilter filter;
    Amount tx_fee_value;
    Amount calc_fee;
    std::vector<Utxo> utxo_list;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      // elements
      option_params.InitializeConfidentialTxSizeInfo();
      ConfidentialAssetId fee_asset = convert_to_asset(buffer->fee_asset);
      option_params.SetFeeAsset(fee_asset);

      std::map<std::string, Amount> map_target_value;
      std::map<std::string, std::string> reserve_txout_address;
      for (const auto& target : *(buffer->targets)) {
        map_target_value.emplace(target.asset, Amount(target.amount));
        reserve_txout_address.emplace(target.asset, target.reserved_address);
      }

      ElementsTransactionApi api;
      ConfidentialTransactionController ctxc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, map_target_value,
          *buffer->input_elements_utxos, reserve_txout_address, fee_asset,
          buffer->is_blind, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(ctxc.GetHex());
      }
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      // bitcoin
      option_params.InitializeTxSizeInfo();
      auto& target = buffer->targets->at(0);
      Amount target_value(target.amount);

      TransactionApi api;
      TransactionController txc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, target_value, *buffer->input_utxos,
          target.reserved_address, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(txc.GetHex());
      }
    }

    buffer->calculate_fee = calc_fee.GetSatoshiValue();
    if (tx_fee != nullptr) {
      *tx_fee = tx_fee_value.GetSatoshiValue();
    }
    if (append_txout_count != nullptr) {
      *append_txout_count =
          static_cast<uint32_t>(buffer->append_txout_addresses->size());
    }

    result = CfdErrorCode::kCfdSuccess;
    return result;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}